

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

BreakIterator * icu_63::BreakIterator::makeInstance(Locale *loc,int32_t kind,UErrorCode *status)

{
  ulong uVar1;
  UErrorCode UVar2;
  int32_t iVar3;
  int iVar4;
  size_t sVar5;
  FilteredBreakIteratorBuilder *pFVar6;
  undefined4 extraout_var;
  BreakIterator *pBVar7;
  BreakIterator *pBVar8;
  char *type;
  UErrorCode kvStatus;
  char lbKeyValue [32];
  char lbType [32];
  UErrorCode local_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  if (U_ZERO_ERROR < *status) {
    return (BreakIterator *)0x0;
  }
  switch(kind) {
  case 0:
    type = "grapheme";
    break;
  case 1:
    type = "word";
    break;
  case 2:
    uVar1 = (ulong)local_48 >> 0x20;
    local_48 = CONCAT44((uint)uVar1 & 0xffffff00,0x656e696c);
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_6c = U_ZERO_ERROR;
    iVar3 = Locale::getKeywordValue(loc,"lb",(char *)&local_68,0x20,&local_6c);
    if ((0 < iVar3) && (local_6c < U_ILLEGAL_ARGUMENT_ERROR)) {
      UVar2 = (UErrorCode)local_68;
      if ((local_68._3_4_ == 0x746369 && UVar2 == 0x69727473) ||
         ((local_68._3_4_ == 0x6c616d && UVar2 == 0x6d726f6e ||
          (local_68._4_2_ == 0x65 && UVar2 == 0x736f6f6c)))) {
        sVar5 = strlen((char *)&local_48);
        *(undefined2 *)((long)&local_48 + sVar5) = 0x5f;
        strcat((char *)&local_48,(char *)&local_68);
      }
    }
    type = (char *)&local_48;
    break;
  case 3:
    pBVar7 = buildInstance(loc,"sentence",status);
    local_38 = 0;
    uStack_30 = 0;
    local_48 = 0;
    uStack_40 = 0;
    local_68 = local_68 & 0xffffffff00000000;
    iVar3 = Locale::getKeywordValue(loc,"ss",(char *)&local_48,0x20,(UErrorCode *)&local_68);
    if (((0 < iVar3) && ((UErrorCode)local_68 < U_ILLEGAL_ARGUMENT_ERROR)) &&
       ((char)uStack_40 == '\0' && local_48 == 0x647261646e617473)) {
      pFVar6 = FilteredBreakIteratorBuilder::createInstance(loc,(UErrorCode *)&local_68);
      if ((UErrorCode)local_68 < U_ILLEGAL_ARGUMENT_ERROR) {
        iVar4 = (*(pFVar6->super_UObject)._vptr_UObject[5])(pFVar6,pBVar7,status);
        pBVar7 = (BreakIterator *)CONCAT44(extraout_var,iVar4);
        (*(pFVar6->super_UObject)._vptr_UObject[1])(pFVar6);
      }
    }
    goto LAB_0028e67f;
  case 4:
    type = "title";
    break;
  default:
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    pBVar7 = (BreakIterator *)0x0;
    goto LAB_0028e67f;
  }
  pBVar7 = buildInstance(loc,type,status);
LAB_0028e67f:
  pBVar8 = (BreakIterator *)0x0;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    pBVar8 = pBVar7;
  }
  return pBVar8;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }